

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

BuilderFor<DynamicCapability> *
capnp::DynamicValue::Builder::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (BuilderFor<DynamicCapability> *__return_storage_ptr__,Builder *builder)

{
  bool bVar1;
  Fault local_58;
  Fault f;
  Type *local_48;
  undefined1 local_40 [8];
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Builder *builder_local;
  
  _kjCondition._32_8_ = builder;
  local_48 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&builder->type);
  f.exception._4_4_ = 0xb;
  kj::_::DebugExpression<capnp::DynamicValue::Type&>::operator==
            ((DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
             (DebugExpression<capnp::DynamicValue::Type&> *)&local_48,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    DynamicCapability::Client::Client(__return_storage_ptr__,(Client *)(_kjCondition._32_8_ + 8));
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[21]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x739,FAILED,"builder.type == CAPABILITY","_kjCondition,\"Value type mismatch.\"",
               (DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> *)local_40,
               (char (*) [21])"Value type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x0;
    DynamicCapability::Client::Client(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

BuilderFor<DynamicCapability> DynamicValue::Builder::AsImpl<DynamicCapability>::apply(
    Builder& builder) {
  KJ_REQUIRE(builder.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return builder.capabilityValue;
}